

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_agent.cpp
# Opt level: O0

Error * ot::commissioner::UnixTime::FromString
                  (Error *__return_storage_ptr__,UnixTime *aTime,string *aTimeStr)

{
  char *__s;
  char *__fmt;
  time_t aTime_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  string_view fmt;
  format_args args;
  anon_class_1_0_00000001 local_14a;
  v10 local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  char *local_140;
  string local_138;
  UnixTime local_118;
  char *local_110;
  char *result;
  tm lTm;
  string *aTimeStr_local;
  UnixTime *aTime_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b8 [3];
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  char *local_88;
  char *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  lTm.tm_zone = (char *)aTimeStr;
  __s = (char *)std::__cxx11::string::c_str();
  __fmt = (char *)std::__cxx11::string::c_str();
  local_110 = strptime(__s,__fmt,(tm *)&result);
  if ((local_110 == (char *)0x0) || (*local_110 != '\0')) {
    FromString::anon_class_1_0_00000001::operator()(&local_14a);
    local_58 = &local_148;
    local_60 = &local_149;
    bVar1 = ::fmt::v10::operator()(local_60);
    local_140 = (char *)bVar1.size_;
    local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar1.data_;
    ::fmt::v10::detail::
    check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
              ();
    local_78 = local_148;
    pcStack_70 = local_140;
    local_80 = lTm.tm_zone;
    local_50 = &local_78;
    local_90 = local_148;
    local_88 = local_140;
    local_68 = &local_138;
    local_48 = local_90;
    pcStack_40 = local_88;
    local_b8[0] = ::fmt::v10::
                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                            ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)lTm.tm_zone,(v10 *)&local_138,local_148);
    local_30 = local_a0;
    local_38 = local_b8;
    local_18 = 0xd;
    fmt.size_ = 0xd;
    fmt.data_ = local_88;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_138,(v10 *)local_90,fmt,args);
    Error::Error(__return_storage_ptr__,kBadFormat,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
  }
  else {
    aTime_00 = mktime((tm *)&result);
    UnixTime(&local_118,aTime_00);
    aTime->mTime = (time_t)local_118;
    Error::Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error UnixTime::FromString(UnixTime &aTime, const std::string &aTimeStr)
{
    std::tm lTm;
    char   *result = strptime(aTimeStr.c_str(), kFmtString.c_str(), &lTm);
    if (result != nullptr && *result == '\000')
    {
        aTime = std::mktime(&lTm);
        return ERROR_NONE;
    }
    return ERROR_BAD_FORMAT("ill formed time string {}", aTimeStr);
}